

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_formatting.c
# Opt level: O2

char * double_all_percent_signs_in(char *original)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *__dest;
  long lVar5;
  
  pcVar2 = next_percent_sign(original);
  lVar5 = 1;
  while (pcVar2 != (char *)0x0) {
    pcVar2 = next_percent_sign(pcVar2 + 1);
    lVar5 = lVar5 + 1;
  }
  sVar3 = strlen(original);
  pcVar2 = (char *)malloc(lVar5 + sVar3);
  if (pcVar2 != (char *)0x0) {
    pcVar4 = next_percent_sign(original);
    __dest = pcVar2;
    while (pcVar4 != (char *)0x0) {
      memcpy(__dest,original,(size_t)(pcVar4 + (1 - (long)original)));
      pcVar1 = pcVar4 + (2 - (long)original);
      __dest[(long)(pcVar4 + (1 - (long)original))] = '%';
      original = pcVar4 + 1;
      pcVar4 = next_percent_sign(original);
      __dest = __dest + (long)pcVar1;
    }
    strcpy(__dest,original);
  }
  return pcVar2;
}

Assistant:

static char *double_all_percent_signs_in(const char *original)
{
    size_t percent_count = count_percent_signs(original);
    char *new_string = (char *)malloc(strlen(original) + percent_count + 1);
    if (new_string == NULL) {
        return NULL;
    }
    copy_while_doubling_percent_signs(new_string, original);
    return new_string;
}